

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O1

int __thiscall ncnn::Convolution1D_x86::create_pipeline(Convolution1D_x86 *this,Option *opt)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  Allocator *pAVar8;
  int k;
  long lVar9;
  uint uVar10;
  void *pvVar11;
  ulong uVar12;
  long lVar13;
  int k_1;
  uint uVar14;
  int iVar15;
  int iVar16;
  void *pvVar17;
  long lVar18;
  ulong uVar19;
  void *pvVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  void *pvVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  void *pvVar30;
  undefined4 *puVar31;
  undefined4 *puVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  void *pvVar36;
  undefined4 *puVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  void *pvVar41;
  long lVar42;
  ulong uVar43;
  void *pvVar44;
  long lVar45;
  int local_c4;
  uint local_a8;
  
  if ((this->super_Convolution1D).dynamic_weight != 0) {
    return 0;
  }
  uVar1 = (this->super_Convolution1D).kernel_w;
  lVar29 = (long)(int)uVar1;
  uVar43 = (ulong)uVar1;
  uVar22 = (long)(this->super_Convolution1D).weight_data_size / (long)(int)uVar1;
  uVar2 = (this->super_Convolution1D).num_output;
  uVar22 = (long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff) /
           (long)(int)uVar2;
  uVar19 = uVar22 & 0xffffffff;
  uVar21 = (uint)uVar22;
  uVar14 = uVar21;
  if ((long)(int)uVar2 < 4) {
    if ((int)uVar2 < 2) {
      uVar10 = uVar2;
      if ((int)uVar21 < 4) {
        uVar23 = uVar1;
        if (1 < (int)uVar21) {
          uVar14 = (uVar21 & 1) + 1;
          uVar23 = uVar1 * 2;
        }
      }
      else {
        uVar14 = (uVar21 & 1) + (int)(uVar19 >> 2) + (uint)((uVar21 >> 1 & 1) != 0);
        uVar23 = uVar1 * 4;
      }
    }
    else {
      if ((int)uVar21 < 4) {
        if ((int)uVar21 < 2) {
          uVar23 = uVar1 * 2;
          uVar10 = (uVar2 & 1) + 1;
          goto LAB_0056cf2b;
        }
        uVar23 = uVar1 * 4;
        uVar14 = (uVar21 & 1) + 1;
      }
      else {
        uVar14 = (uVar21 & 1) + (int)(uVar19 >> 2) + (uint)((uVar21 >> 1 & 1) != 0);
        uVar23 = uVar1 * 8;
      }
      uVar10 = (uVar2 & 1) + 1;
    }
  }
  else {
    if ((int)uVar21 < 4) {
      if ((int)uVar21 < 2) {
        uVar23 = uVar1 * 4;
        uVar10 = (uVar2 & 1) + (uVar2 >> 2) + (uint)((uVar2 >> 1 & 1) != 0);
        goto LAB_0056cf2b;
      }
      uVar23 = uVar1 * 8;
      uVar14 = (uVar21 & 1) + 1;
    }
    else {
      uVar23 = uVar1 << 4;
      uVar14 = (uVar21 & 1) + (int)(uVar19 >> 2) + (uint)((uVar21 >> 1 & 1) != 0);
    }
    uVar10 = (uVar2 & 1) + (uVar2 >> 2) + (uint)((uVar2 >> 1 & 1) != 0);
  }
LAB_0056cf2b:
  Mat::create(&this->weight_data_tm,uVar23,uVar14,uVar10,4,(Allocator *)0x0);
  uVar22 = 0;
  if (3 < (int)uVar2) {
    pvVar3 = (this->super_Convolution1D).weight_data.data;
    pvVar4 = (this->weight_data_tm).data;
    iVar15 = uVar21 * uVar1;
    sVar5 = (this->weight_data_tm).elemsize;
    sVar6 = (this->weight_data_tm).cstep;
    iVar28 = uVar1 * uVar21;
    iVar34 = iVar28 * 3;
    iVar24 = iVar28 * 4;
    lVar25 = (long)(int)(uVar1 * 4) * 4;
    iVar28 = iVar28 * 2;
    lVar9 = (long)(int)(uVar1 * 2) * 4;
    iVar40 = 0;
    uVar19 = 0;
    iVar16 = iVar15;
    do {
      puVar32 = (undefined4 *)((uVar19 >> 2) * sVar5 * sVar6 + (long)pvVar4);
      if ((int)uVar21 < 4) {
        uVar14 = (uint)uVar19;
        pvVar41 = (void *)((long)pvVar3 + (long)(int)(iVar15 * uVar14) * 4);
        pvVar36 = (void *)((long)pvVar3 + (long)(int)((uVar14 | 1) * iVar15) * 4);
        pvVar26 = (void *)((long)pvVar3 + (long)(int)((uVar14 | 2) * iVar15) * 4);
        pvVar20 = (void *)((long)pvVar3 + (long)(int)((uVar14 | 3) * iVar15) * 4);
        uVar14 = 0;
      }
      else {
        pvVar20 = (void *)((long)pvVar3 + (long)iVar34 * 4);
        pvVar26 = (void *)((long)pvVar3 + (long)iVar28 * 4);
        pvVar36 = (void *)((long)pvVar3 + (long)iVar16 * 4);
        pvVar41 = (void *)((long)pvVar3 + (long)iVar40 * 4);
        iVar38 = 0;
        do {
          if (0 < (int)uVar1) {
            uVar22 = 0;
            pvVar11 = pvVar36;
            pvVar17 = pvVar26;
            pvVar30 = pvVar20;
            pvVar44 = pvVar41;
            do {
              puVar31 = puVar32;
              lVar33 = 0;
              lVar35 = 0;
              do {
                *(undefined4 *)((long)puVar31 + lVar35) = *(undefined4 *)((long)pvVar44 + lVar33);
                *(undefined4 *)((long)puVar31 + lVar35 + 4) =
                     *(undefined4 *)((long)pvVar11 + lVar33);
                *(undefined4 *)((long)puVar31 + lVar35 + 8) =
                     *(undefined4 *)((long)pvVar17 + lVar33);
                *(undefined4 *)((long)puVar31 + lVar35 + 0xc) =
                     *(undefined4 *)((long)pvVar30 + lVar33);
                lVar35 = lVar35 + 0x10;
                lVar33 = lVar33 + lVar29 * 4;
              } while ((int)lVar35 != 0x40);
              uVar22 = uVar22 + 1;
              pvVar30 = (void *)((long)pvVar30 + 4);
              pvVar17 = (void *)((long)pvVar17 + 4);
              pvVar11 = (void *)((long)pvVar11 + 4);
              pvVar44 = (void *)((long)pvVar44 + 4);
              puVar32 = (undefined4 *)((long)puVar31 + lVar35);
            } while (uVar22 != uVar43);
            puVar32 = (undefined4 *)((long)puVar31 + lVar35);
          }
          pvVar41 = (void *)((long)pvVar41 + lVar25);
          pvVar36 = (void *)((long)pvVar36 + lVar25);
          pvVar26 = (void *)((long)pvVar26 + lVar25);
          pvVar20 = (void *)((long)pvVar20 + lVar25);
          iVar39 = iVar38 + 7;
          iVar38 = iVar38 + 4;
          uVar14 = uVar21 & 0xfffffffc;
        } while (iVar39 < (int)uVar21);
      }
      uVar23 = uVar14 | 1;
      while ((int)uVar23 < (int)uVar21) {
        if (0 < (int)uVar1) {
          uVar22 = 0;
          pvVar11 = pvVar36;
          pvVar17 = pvVar26;
          pvVar30 = pvVar20;
          pvVar44 = pvVar41;
          do {
            puVar31 = puVar32;
            lVar33 = 0;
            lVar35 = 0;
            do {
              *(undefined4 *)((long)puVar31 + lVar35) = *(undefined4 *)((long)pvVar44 + lVar33);
              *(undefined4 *)((long)puVar31 + lVar35 + 4) = *(undefined4 *)((long)pvVar11 + lVar33);
              *(undefined4 *)((long)puVar31 + lVar35 + 8) = *(undefined4 *)((long)pvVar17 + lVar33);
              *(undefined4 *)((long)puVar31 + lVar35 + 0xc) =
                   *(undefined4 *)((long)pvVar30 + lVar33);
              lVar35 = lVar35 + 0x10;
              lVar33 = lVar33 + lVar29 * 4;
            } while ((int)lVar35 == 0x10);
            uVar22 = uVar22 + 1;
            pvVar30 = (void *)((long)pvVar30 + 4);
            pvVar17 = (void *)((long)pvVar17 + 4);
            pvVar11 = (void *)((long)pvVar11 + 4);
            pvVar44 = (void *)((long)pvVar44 + 4);
            puVar32 = (undefined4 *)((long)puVar31 + lVar35);
          } while (uVar22 != uVar43);
          puVar32 = (undefined4 *)((long)puVar31 + lVar35);
        }
        pvVar41 = (void *)((long)pvVar41 + lVar9);
        pvVar36 = (void *)((long)pvVar36 + lVar9);
        pvVar26 = (void *)((long)pvVar26 + lVar9);
        pvVar20 = (void *)((long)pvVar20 + lVar9);
        uVar23 = uVar14 + 3;
        uVar14 = uVar14 + 2;
      }
      if ((int)uVar14 < (int)uVar21) {
        do {
          if (0 < (int)uVar1) {
            uVar22 = 0;
            do {
              *puVar32 = *(undefined4 *)((long)pvVar41 + uVar22 * 4);
              puVar32[1] = *(undefined4 *)((long)pvVar36 + uVar22 * 4);
              puVar32[2] = *(undefined4 *)((long)pvVar26 + uVar22 * 4);
              puVar32[3] = *(undefined4 *)((long)pvVar20 + uVar22 * 4);
              puVar32 = puVar32 + 4;
              uVar22 = uVar22 + 1;
            } while (uVar43 != uVar22);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar21);
      }
      uVar22 = uVar19 + 4;
      uVar12 = uVar19 + 7;
      iVar34 = iVar34 + iVar24;
      iVar28 = iVar28 + iVar24;
      iVar16 = iVar16 + iVar24;
      iVar40 = iVar40 + iVar24;
      uVar19 = uVar22;
    } while (uVar12 < uVar2);
  }
  uVar14 = (uint)uVar22 | 1;
  if ((int)uVar14 < (int)uVar2) {
    pvVar3 = (this->super_Convolution1D).weight_data.data;
    pvVar4 = (this->weight_data_tm).data;
    iVar34 = uVar21 * uVar1;
    sVar5 = (this->weight_data_tm).elemsize;
    sVar6 = (this->weight_data_tm).cstep;
    lVar25 = (long)(int)(uVar1 * 2);
    local_c4 = uVar1 * uVar21 * uVar14;
    iVar24 = uVar1 * uVar21 * 2;
    lVar9 = (long)(int)(uVar1 * 4) * 4;
    iVar28 = (uint)uVar22 * iVar34;
    uVar19 = uVar22 & 0xffffffff;
    do {
      puVar32 = (undefined4 *)
                ((ulong)(((uint)(uVar19 >> 2) & 0x3fffffff) + (uint)(((uint)uVar19 >> 1 & 1) != 0))
                 * sVar5 * sVar6 + (long)pvVar4);
      if ((int)uVar21 < 4) {
        pvVar41 = (void *)((long)pvVar3 + (long)(int)(iVar34 * (uint)uVar19) * 4);
        pvVar36 = (void *)((long)pvVar3 + (long)(int)(uVar14 * iVar34) * 4);
        uVar14 = 0;
      }
      else {
        lVar13 = (long)local_c4;
        lVar33 = (long)pvVar3 + lVar13 * 4 + (long)(int)(uVar1 * 3) * 4;
        lVar35 = (long)pvVar3 + lVar13 * 4 + lVar25 * 4;
        lVar42 = (long)pvVar3 + lVar13 * 4 + lVar29 * 4;
        pvVar36 = (void *)((long)pvVar3 + lVar13 * 4);
        lVar27 = (long)iVar28;
        lVar13 = (long)pvVar3 + lVar27 * 4 + (long)(int)(uVar1 * 3) * 4;
        lVar45 = (long)pvVar3 + lVar27 * 4 + lVar25 * 4;
        lVar18 = (long)pvVar3 + lVar27 * 4 + lVar29 * 4;
        pvVar41 = (void *)((long)pvVar3 + lVar27 * 4);
        iVar16 = 0;
        do {
          if (0 < (int)uVar1) {
            lVar27 = 0;
            puVar31 = puVar32;
            do {
              puVar37 = puVar31;
              puVar31 = puVar32 + lVar27 * 2;
              *puVar31 = *(undefined4 *)((long)pvVar41 + lVar27);
              puVar31[1] = *(undefined4 *)(lVar18 + lVar27);
              puVar31[2] = *(undefined4 *)(lVar45 + lVar27);
              puVar31[3] = *(undefined4 *)(lVar13 + lVar27);
              puVar31[4] = *(undefined4 *)((long)pvVar36 + lVar27);
              puVar31[5] = *(undefined4 *)(lVar42 + lVar27);
              puVar31[6] = *(undefined4 *)(lVar35 + lVar27);
              puVar31[7] = *(undefined4 *)(lVar33 + lVar27);
              lVar27 = lVar27 + 4;
              puVar31 = puVar31 + 8;
            } while (uVar43 * 4 != lVar27);
            puVar32 = puVar37 + 8;
          }
          pvVar41 = (void *)((long)pvVar41 + lVar9);
          pvVar36 = (void *)((long)pvVar36 + lVar9);
          iVar15 = iVar16 + 7;
          lVar33 = lVar33 + lVar9;
          lVar35 = lVar35 + lVar9;
          lVar42 = lVar42 + lVar9;
          lVar13 = lVar13 + lVar9;
          lVar45 = lVar45 + lVar9;
          lVar18 = lVar18 + lVar9;
          uVar14 = uVar21 & 0xfffffffc;
          iVar16 = iVar16 + 4;
        } while (iVar15 < (int)uVar21);
      }
      uVar23 = uVar14 | 1;
      while ((int)uVar23 < (int)uVar21) {
        if (0 < (int)uVar1) {
          uVar22 = 0;
          pvVar26 = pvVar41;
          pvVar20 = pvVar36;
          do {
            puVar31 = puVar32;
            lVar33 = 0;
            lVar35 = 0;
            do {
              *(undefined4 *)((long)puVar31 + lVar35) = *(undefined4 *)((long)pvVar26 + lVar33);
              *(undefined4 *)((long)puVar31 + lVar35 + 4) = *(undefined4 *)((long)pvVar20 + lVar33);
              lVar35 = lVar35 + 8;
              lVar33 = lVar33 + lVar29 * 4;
            } while ((int)lVar35 == 8);
            uVar22 = uVar22 + 1;
            pvVar20 = (void *)((long)pvVar20 + 4);
            pvVar26 = (void *)((long)pvVar26 + 4);
            puVar32 = (undefined4 *)((long)puVar31 + lVar35);
          } while (uVar22 != uVar43);
          puVar32 = (undefined4 *)((long)puVar31 + lVar35);
        }
        pvVar41 = (void *)((long)pvVar41 + lVar25 * 4);
        pvVar36 = (void *)((long)pvVar36 + lVar25 * 4);
        uVar23 = uVar14 + 3;
        uVar14 = uVar14 + 2;
      }
      if ((int)uVar14 < (int)uVar21) {
        do {
          if (0 < (int)uVar1) {
            uVar22 = 0;
            do {
              *puVar32 = *(undefined4 *)((long)pvVar41 + uVar22 * 4);
              puVar32[1] = *(undefined4 *)((long)pvVar36 + uVar22 * 4);
              puVar32 = puVar32 + 2;
              uVar22 = uVar22 + 1;
            } while (uVar43 != uVar22);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar21);
      }
      uVar22 = uVar19 + 2;
      lVar33 = uVar19 + 3;
      uVar14 = (uint)lVar33;
      local_c4 = local_c4 + iVar24;
      iVar28 = iVar28 + iVar24;
      uVar19 = uVar22;
    } while (lVar33 < (int)uVar2);
    uVar22 = uVar22 & 0xffffffff;
  }
  if ((int)uVar22 < (int)uVar2) {
    pvVar3 = (this->super_Convolution1D).weight_data.data;
    pvVar4 = (this->weight_data_tm).data;
    sVar5 = (this->weight_data_tm).elemsize;
    sVar6 = (this->weight_data_tm).cstep;
    local_a8 = uVar21 & 0xfffffffc;
    uVar19 = uVar22 & 0xffffffff;
    iVar24 = (int)uVar22 * uVar21 * uVar1;
    do {
      uVar14 = (uint)uVar19;
      pvVar41 = (void *)((ulong)((uVar14 & 1) + ((uint)(uVar19 >> 2) & 0x3fffffff) +
                                (uint)((uVar14 >> 1 & 1) != 0)) * sVar5 * sVar6 + (long)pvVar4);
      if ((int)uVar21 < 4) {
        puVar32 = (undefined4 *)((long)pvVar3 + (long)(int)(uVar21 * uVar1 * uVar14) * 4);
        uVar14 = 0;
      }
      else {
        puVar32 = (undefined4 *)((long)pvVar3 + (long)iVar24 * 4);
        iVar34 = 0;
        do {
          if (0 < (int)uVar1) {
            uVar22 = 0;
            puVar31 = puVar32;
            do {
              pvVar36 = pvVar41;
              lVar9 = 0;
              puVar37 = puVar31;
              do {
                *(undefined4 *)((long)pvVar36 + lVar9) = *puVar37;
                lVar9 = lVar9 + 4;
                puVar37 = puVar37 + lVar29;
              } while ((int)lVar9 != 0x10);
              uVar22 = uVar22 + 1;
              puVar31 = puVar31 + 1;
              pvVar41 = (void *)(lVar9 + (long)pvVar36);
            } while (uVar22 != uVar43);
            pvVar41 = (void *)((long)pvVar36 + lVar9);
          }
          puVar32 = puVar32 + (int)(uVar1 * 4);
          iVar28 = iVar34 + 7;
          iVar34 = iVar34 + 4;
          uVar14 = local_a8;
        } while (iVar28 < (int)uVar21);
      }
      uVar23 = uVar14 | 1;
      while ((int)uVar23 < (int)uVar21) {
        if (0 < (int)uVar1) {
          uVar22 = 0;
          puVar31 = puVar32;
          do {
            pvVar36 = pvVar41;
            lVar9 = 0;
            puVar37 = puVar31;
            do {
              *(undefined4 *)((long)pvVar36 + lVar9) = *puVar37;
              lVar9 = lVar9 + 4;
              puVar37 = puVar37 + lVar29;
            } while ((int)lVar9 == 4);
            uVar22 = uVar22 + 1;
            puVar31 = puVar31 + 1;
            pvVar41 = (void *)(lVar9 + (long)pvVar36);
          } while (uVar22 != uVar43);
          pvVar41 = (void *)((long)pvVar36 + lVar9);
        }
        puVar32 = puVar32 + (int)(uVar1 * 2);
        uVar23 = uVar14 + 3;
        uVar14 = uVar14 + 2;
      }
      if ((int)uVar14 < (int)uVar21) {
        do {
          if (0 < (int)uVar1) {
            lVar9 = 0;
            do {
              *(undefined4 *)((long)pvVar41 + lVar9) = *(undefined4 *)((long)puVar32 + lVar9);
              lVar9 = lVar9 + 4;
            } while (uVar43 * 4 - lVar9 != 0);
            pvVar41 = (void *)((long)pvVar41 + lVar9);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar21);
      }
      uVar19 = uVar19 + 1;
      iVar24 = iVar24 + uVar1 * uVar21;
    } while (uVar19 != uVar2);
  }
  if (opt->lightmode == true) {
    piVar7 = (this->super_Convolution1D).weight_data.refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        pvVar3 = (this->super_Convolution1D).weight_data.data;
        pAVar8 = (this->super_Convolution1D).weight_data.allocator;
        if (pAVar8 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar8->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution1D).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_Convolution1D).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_Convolution1D).weight_data.elemsize + 4) = 0;
    (this->super_Convolution1D).weight_data.data = (void *)0x0;
    (this->super_Convolution1D).weight_data.refcount = (int *)0x0;
    (this->super_Convolution1D).weight_data.dims = 0;
    (this->super_Convolution1D).weight_data.w = 0;
    (this->super_Convolution1D).weight_data.h = 0;
    (this->super_Convolution1D).weight_data.d = 0;
    (this->super_Convolution1D).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution1D_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}